

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::access_chain_internal_append_index
          (CompilerGLSL *this,string *expr,uint32_t param_2,SPIRType *param_3,AccessChainFlags flags
          ,bool *access_chain_is_arrayed,uint32_t index)

{
  CompilerGLSL *this_00;
  string idx_expr;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string expr_back;
  string expr_front;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((flags & 1) == 0) {
    to_unpacked_expression_abi_cxx11_(&idx_expr,this,index,(flags & 8) == 0);
  }
  else {
    ::std::__cxx11::to_string(&idx_expr,index);
  }
  if (((flags & 4) == 0) || (*access_chain_is_arrayed != true)) {
    ::std::__cxx11::string::append((char *)expr);
    ::std::__cxx11::string::append((string *)expr);
    ::std::__cxx11::string::append((char *)expr);
  }
  else {
    ::std::__cxx11::string::rfind((char)expr,0x5d);
    ::std::__cxx11::string::substr((ulong)&expr_front,(ulong)expr);
    ::std::__cxx11::string::substr((ulong)&expr_back,(ulong)expr);
    this_00 = (CompilerGLSL *)&expr_front;
    ::std::operator+(&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                     " + ");
    enclose_expression(&local_d8,this_00,&idx_expr);
    ::std::operator+(&local_98,&local_b8,&local_d8);
    ::std::operator+(&local_38,&local_98,&expr_back);
    ::std::__cxx11::string::operator=((string *)expr,(string *)&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
    ::std::__cxx11::string::~string((string *)&local_98);
    ::std::__cxx11::string::~string((string *)&local_d8);
    ::std::__cxx11::string::~string((string *)&local_b8);
    ::std::__cxx11::string::~string((string *)&expr_back);
    ::std::__cxx11::string::~string((string *)&expr_front);
  }
  ::std::__cxx11::string::~string((string *)&idx_expr);
  return;
}

Assistant:

void CompilerGLSL::access_chain_internal_append_index(std::string &expr, uint32_t /*base*/, const SPIRType * /*type*/,
                                                      AccessChainFlags flags, bool &access_chain_is_arrayed,
                                                      uint32_t index)
{
	bool index_is_literal = (flags & ACCESS_CHAIN_INDEX_IS_LITERAL_BIT) != 0;
	bool ptr_chain = (flags & ACCESS_CHAIN_PTR_CHAIN_BIT) != 0;
	bool register_expression_read = (flags & ACCESS_CHAIN_SKIP_REGISTER_EXPRESSION_READ_BIT) == 0;

	string idx_expr = index_is_literal ? convert_to_string(index) : to_unpacked_expression(index, register_expression_read);

	// For the case where the base of an OpPtrAccessChain already ends in [n],
	// we need to use the index as an offset to the existing index, otherwise,
	// we can just use the index directly.
	if (ptr_chain && access_chain_is_arrayed)
	{
		size_t split_pos = expr.find_last_of(']');
		string expr_front = expr.substr(0, split_pos);
		string expr_back = expr.substr(split_pos);
		expr = expr_front + " + " +  enclose_expression(idx_expr) + expr_back;
	}
	else
	{
		expr += "[";
		expr += idx_expr;
		expr += "]";
	}
}